

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeamManager.cpp
# Opt level: O0

void __thiscall TeamManager::_showMenu(TeamManager *this)

{
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  TeamManager *local_10;
  TeamManager *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"= Team Managing =\n",&local_31);
  Console::writeLine(&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"[1]. Construct team from trash",&local_69);
  Console::writeLine(&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"[2]. Show Team",&local_91)
  ;
  Console::writeLine(&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"[3]. Add Hero",&local_b9);
  Console::writeLine(&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"[4]. Remove Hero\n",&local_e1);
  Console::writeLine(&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"[5]. Hero Encyclopedia\n",&local_109);
  Console::writeLine(&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"[6]. Back",&local_131);
  Console::writeLine(&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  return;
}

Assistant:

void TeamManager::_showMenu()
{
    Console::writeLine("= Team Managing =\n");
    Console::writeLine("[1]. Construct team from trash");
    Console::writeLine("[2]. Show Team");
    Console::writeLine("[3]. Add Hero");
    Console::writeLine("[4]. Remove Hero\n");
    Console::writeLine("[5]. Hero Encyclopedia\n");
    Console::writeLine("[6]. Back");
}